

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.cpp
# Opt level: O0

int mbedtls_cipher_setup(mbedtls_cipher_context_t *ctx,mbedtls_cipher_info_t *cipher_info)

{
  mbedtls_cipher_base_t *pmVar1;
  void *pvVar2;
  mbedtls_cipher_info_t *in_RSI;
  undefined8 *in_RDI;
  int local_4;
  
  if (in_RSI == (mbedtls_cipher_info_t *)0x0) {
    local_4 = -0x6100;
  }
  else {
    memset(in_RDI,0,0x48);
    pmVar1 = mbedtls_cipher_get_base(in_RSI);
    if (pmVar1->ctx_alloc_func != (_func_void_ptr *)0x0) {
      pmVar1 = mbedtls_cipher_get_base(in_RSI);
      pvVar2 = (*pmVar1->ctx_alloc_func)();
      in_RDI[8] = pvVar2;
      if (in_RDI[8] == 0) {
        return -0x6180;
      }
    }
    *in_RDI = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mbedtls_cipher_setup(mbedtls_cipher_context_t *ctx,
                         const mbedtls_cipher_info_t *cipher_info)
{
    if (cipher_info == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    memset(ctx, 0, sizeof(mbedtls_cipher_context_t));

    if (mbedtls_cipher_get_base(cipher_info)->ctx_alloc_func != NULL) {
        ctx->cipher_ctx = mbedtls_cipher_get_base(cipher_info)->ctx_alloc_func();
        if (ctx->cipher_ctx == NULL) {
            return MBEDTLS_ERR_CIPHER_ALLOC_FAILED;
        }
    }

    ctx->cipher_info = cipher_info;

    return 0;
}